

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

vector<bool,_std::allocator<bool>_> * __thiscall
spoa::Graph::ExtractSubgraph
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,Graph *this,Node *begin,
          Node *end)

{
  ulong *puVar1;
  uint uVar2;
  pointer ppEVar3;
  Node **ppNVar4;
  Node *pNVar5;
  Edge **it;
  pointer ppEVar6;
  Node **__args;
  stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
  stack;
  allocator_type local_89;
  _Deque_base<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_> local_88;
  Node *local_38;
  
  local_88._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)((ulong)local_88._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
  local_38 = begin;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_88,&local_89);
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::
  _M_initialize_map(&local_88,0);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<spoa::Graph::Node_const*,std::allocator<spoa::Graph::Node_const*>>::
    _M_push_back_aux<spoa::Graph::Node_const*const&>
              ((deque<spoa::Graph::Node_const*,std::allocator<spoa::Graph::Node_const*>> *)&local_88
               ,&local_38);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = begin;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pNVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        pNVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      uVar2 = pNVar5->id;
      if ((((__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] >>
            ((ulong)uVar2 & 0x3f) & 1) == 0) && (end->id <= uVar2)) {
        ppEVar3 = (pNVar5->inedges).
                  super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppEVar6 = (pNVar5->inedges).
                       super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppEVar6 != ppEVar3;
            ppEVar6 = ppEVar6 + 1) {
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<spoa::Graph::Node_const*,std::allocator<spoa::Graph::Node_const*>>::
            _M_push_back_aux<spoa::Graph::Node_const*const&>
                      ((deque<spoa::Graph::Node_const*,std::allocator<spoa::Graph::Node_const*>> *)
                       &local_88,&(*ppEVar6)->tail);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (*ppEVar6)->tail;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        ppNVar4 = (pNVar5->aligned_nodes).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (__args = (pNVar5->aligned_nodes).
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; __args != ppNVar4;
            __args = __args + 1) {
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<spoa::Graph::Node_const*,std::allocator<spoa::Graph::Node_const*>>::
            _M_push_back_aux<spoa::Graph::Node_const*const&>
                      ((deque<spoa::Graph::Node_const*,std::allocator<spoa::Graph::Node_const*>> *)
                       &local_88,__args);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = *__args;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        puVar1 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (pNVar5->id >> 6)
        ;
        *puVar1 = *puVar1 | 1L << ((ulong)pNVar5->id & 0x3f);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::
  ~_Deque_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> Graph::ExtractSubgraph(const Node* begin, const Node* end) const {  // NOLINT
  std::vector<bool> dst(nodes_.size(), false);
  std::stack<const Node*> stack;
  stack.push(begin);

  while (!stack.empty()) {
    auto curr = stack.top();
    stack.pop();

    if (!dst[curr->id] && curr->id >= end->id) {
      for (const auto& it : curr->inedges) {
        stack.push(it->tail);
      }
      for (const auto& it : curr->aligned_nodes) {
        stack.push(it);
      }
      dst[curr->id] = true;
    }
  }

  return dst;
}